

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<short,signed_char>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int iVar2;
  int local_34;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2a;
  
  su.m_int = '\0';
  st2.m_int = 0;
  local_2a.m_int = 0;
  SafeInt::operator_cast_to_signed_char((SafeInt *)&local_2a);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\0');
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            (&local_2a,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  operator*('\0',local_2a);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\0');
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  iVar2 = 1;
  local_34 = iVar2;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,
             &local_34);
  local_34 = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
             &local_34);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\x01'
            );
  local_34 = iVar2;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,&local_34);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%(&local_2a,st2);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\x01'
            );
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,su);
  local_34 = iVar2;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,&local_34);
  local_34 = iVar2;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,
             &local_34);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\x01'
            );
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/(&local_2a,st2);
  operator/('\x01',local_2a);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\x01'
            );
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,su);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\x01'
            );
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+(&local_2a,st2);
  operator+('\x01',local_2a);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\x01'
            );
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,su);
  local_34 = 0;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,
             &local_34);
  local_34 = 0;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,&local_34);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\0');
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-(&local_2a,st2);
  operator-('\0',local_2a);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\0');
  local_34 = iVar2;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,
             &local_34);
  local_34 = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
             &local_34);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,su);
  local_34 = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
             &local_34);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\x01'
            );
  SVar1 = SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                    ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &local_2a,su);
  operator<<(SVar1.m_int,su);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\x01'
            );
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,su);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\x01'
            );
  SVar1 = SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                    ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &local_2a,su);
  operator>>(SVar1.m_int,su);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,'\x01'
            );
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2a,su);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&(&local_2a,st2);
  BinaryAndHelper<short,_signed_char,_1>::And(local_2a.m_int,'\x01');
  local_2a.m_int = local_2a.m_int & st2.m_int;
  local_2a.m_int = BinaryAndHelper<short,_signed_char,_1>::And(local_2a.m_int,'\x01');
  local_2a.m_int = BinaryAndHelper<short,_signed_char,_1>::And(local_2a.m_int,su.m_int);
  BinaryOrHelper<short,_signed_char,_1>::Or(local_2a.m_int,'\x01');
  local_2a.m_int = local_2a.m_int | st2.m_int;
  local_2a.m_int = BinaryOrHelper<short,_signed_char,_1>::Or(local_2a.m_int,'\x01');
  local_2a.m_int = BinaryOrHelper<short,_signed_char,_1>::Or(local_2a.m_int,su.m_int);
  BinaryXorHelper<short,_signed_char,_1>::Xor(local_2a.m_int,'\x01');
  local_2a.m_int = local_2a.m_int ^ st2.m_int;
  local_2a.m_int = BinaryXorHelper<short,_signed_char,_1>::Xor(local_2a.m_int,'\x01');
  BinaryXorHelper<short,_signed_char,_1>::Xor(local_2a.m_int,su.m_int);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}